

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O2

int Bmc_EcoSolve(sat_solver *pSat,int Root,Vec_Int_t *vVars)

{
  int *piVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint local_44;
  int pLits [2];
  Vec_Int_t *local_38;
  
  p = Vec_IntAlloc(vVars->nSize);
  iVar3 = sat_solver_nvars(pSat);
  sat_solver_setnvars(pSat,iVar3 + 1);
  pLits[0] = Abc_Var2Lit(Root,0);
  pLits[1] = Abc_Var2Lit(iVar3,0);
  local_44 = 0;
  local_38 = p;
  do {
    iVar3 = sat_solver_solve(pSat,pLits,(lit *)&local_38,1000000,0,0,0);
    if (iVar3 != 1) {
      iVar7 = 1;
      if (iVar3 != -1) {
        iVar7 = -1;
        if (iVar3 != 0) {
          __assert_fail("status == l_True",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                        ,0x9b,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
        }
      }
LAB_00463ab7:
      Vec_IntFree(p);
      return iVar7;
    }
    p->nSize = 0;
    iVar3 = Abc_LitNot(pLits[0]);
    Vec_IntPush(p,iVar3);
    for (iVar3 = 0; iVar3 < vVars->nSize; iVar3 = iVar3 + 1) {
      uVar4 = Vec_IntEntry(vVars,iVar3);
      if (((int)uVar4 < 0) || (pSat->size <= (int)uVar4)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0xd5,"int sat_solver_var_literal(sat_solver *, int)");
      }
      Vec_IntPush(p,(uint)(pSat->model[uVar4] != 1) + uVar4 * 2);
    }
    iVar3 = sat_solver_solve(pSat,p->pArray,p->pArray + p->nSize,1000000,0,0,0);
    if (iVar3 != -1) {
      iVar7 = -1;
      if ((iVar3 != 0) && (iVar7 = 0, iVar3 != 1)) {
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                      ,0xa7,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
      }
      goto LAB_00463ab7;
    }
    piVar1 = (pSat->conf_final).ptr;
    uVar4 = (pSat->conf_final).size;
    p->nSize = 0;
    iVar3 = Abc_LitNot(pLits[1]);
    Vec_IntPush(p,iVar3);
    printf("Cube %d : ",(ulong)local_44);
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
      if (piVar1[uVar6] != pLits[0]) {
        Vec_IntPush(local_38,piVar1[uVar6]);
        iVar3 = Abc_Lit2Var(piVar1[uVar6]);
        uVar5 = (ulong)(uint)vVars->nSize;
        if (vVars->nSize < 1) {
          uVar5 = 0;
        }
        uVar8 = 0;
        while( true ) {
          if (uVar5 == uVar8) {
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                          ,0xb2,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
          }
          if (vVars->pArray[uVar8] == iVar3) break;
          uVar8 = uVar8 + 1;
        }
        iVar3 = Abc_LitIsCompl(piVar1[uVar6]);
        pcVar2 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
        if (iVar3 == 0) {
          pcVar2 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
        }
        printf("%s%d ",pcVar2 + 0x4a,uVar8 & 0xffffffff);
      }
    }
    putchar(10);
    p = local_38;
    iVar3 = sat_solver_addclause(pSat,local_38->pArray,local_38->pArray + local_38->nSize);
    local_44 = local_44 + 1;
    if (iVar3 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                    ,0xb7,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
    }
  } while( true );
}

Assistant:

int Bmc_EcoSolve( sat_solver * pSat, int Root, Vec_Int_t * vVars )
{
    int nBTLimit = 1000000;
    Vec_Int_t * vLits   = Vec_IntAlloc( Vec_IntSize(vVars) );
    int status, i, Div, iVar, nFinal, * pFinal, nIter = 0, RetValue = 0;
    int pLits[2], nVars = sat_solver_nvars( pSat );
    sat_solver_setnvars( pSat, nVars + 1 );
    pLits[0] = Abc_Var2Lit( Root, 0 );  // F = 1
    pLits[1] = Abc_Var2Lit( nVars, 0 ); // iNewLit
    while ( 1 ) 
    {
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            { RetValue = -1; break; }
        if ( status == l_False )
            { RetValue = 1; break; }
        assert( status == l_True );
        // collect divisor literals
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_LitNot(pLits[0]) ); // F = 0
        Vec_IntForEachEntry( vVars, Div, i )
            Vec_IntPush( vLits, sat_solver_var_literal(pSat, Div) );
        // check against offset
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            { RetValue = -1; break; }
        if ( status == l_True )
            break;
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( pSat, &pFinal );
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
        printf( "Cube %d : ", nIter );
        for ( i = 0; i < nFinal; i++ )
        {
            if ( pFinal[i] == pLits[0] )
                continue;
            Vec_IntPush( vLits, pFinal[i] );
            iVar = Vec_IntFind( vVars, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
            printf( "%s%d ", Abc_LitIsCompl(pFinal[i]) ? "+":"-", iVar );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
        assert( status );
        nIter++;
    }
//    assert( status == l_True );
    Vec_IntFree( vLits );
    return RetValue;
}